

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<std::__cxx11::string>
          (AsciiParser *this,char sep,char end_symbol,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  int iVar4;
  allocator local_75;
  undefined4 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char c;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(result);
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    bVar2 = ReadBasicType(this,&value);
    if (bVar2) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(result,&value);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&c,"Not starting with the value of requested type.\n",&local_75);
      PushError(this,(string *)&c);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      local_74 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
      do {
        bVar2 = Eof(this);
        if (bVar2) goto LAB_002c598c;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,&c);
        if (!bVar2) {
          return false;
        }
        if (c == sep) {
          bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          bVar2 = LookChar1(this,(char *)&value);
          if (!bVar2) {
            return false;
          }
          iVar4 = 3;
          if ((char)value._M_dataplus._M_p != (char)local_74) goto LAB_002c5910;
        }
        else {
LAB_002c5910:
          if (c != sep) {
            pSVar1 = this->_sr;
            if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_)) {
              pSVar1->idx_ = uVar3;
            }
            goto LAB_002c598c;
          }
          bVar2 = SkipWhitespaceAndNewline(this,true);
          if (!bVar2) {
            return false;
          }
          value._M_dataplus._M_p = (pointer)&value.field_2;
          value._M_string_length = 0;
          value.field_2._M_local_buf[0] = '\0';
          bVar2 = ReadBasicType(this,&value);
          iVar4 = 3;
          if (bVar2) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(result,&value);
            iVar4 = 0;
          }
          ::std::__cxx11::string::_M_dispose();
        }
      } while (iVar4 == 0);
      if (iVar4 != 1) {
LAB_002c598c:
        if ((result->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (result->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        ::std::__cxx11::string::string((string *)&value,"Empty array.\n",(allocator *)&c);
        PushError(this,&value);
        ::std::__cxx11::string::_M_dispose();
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}